

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::InitializeConnectionRequest::ParseFromArray
          (InitializeConnectionRequest *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  undefined1 uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  bool bVar10;
  uint *puVar11;
  uint *puVar12;
  ulong uVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  uint *in_R11;
  uint *puVar18;
  uint *puVar19;
  bool bVar20;
  uint *local_80;
  Field local_78;
  uint *local_68;
  InitializeConnectionRequest *local_60;
  uint *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar19 = (uint *)(size + (long)raw);
  do {
    lVar8 = 7;
    if (puVar19 <= raw) goto LAB_0027b801;
    uVar13 = (ulong)(char)(byte)*raw;
    puVar12 = (uint *)((long)raw + 1);
    if ((long)uVar13 < 0) {
      bVar1 = (byte)*raw;
      uVar5 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar9 = puVar12;
      for (lVar7 = lVar8;
          (puVar14 = puVar9, uVar13 = uVar5, (char)bVar1 < '\0' &&
          (bVar20 = 0x38 < lVar7 - 7U, bVar10 = bVar20 || puVar19 <= puVar9, puVar14 = puVar12,
          uVar13 = 0, !bVar20 && puVar19 > puVar9)); lVar7 = lVar7 + 7) {
        bVar1 = (byte)*puVar9;
        in_R11 = (uint *)((ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f));
        puVar9 = (uint *)((long)puVar9 + 1);
        uVar5 = uVar5 | (ulong)in_R11;
      }
      puVar12 = puVar14;
      if (bVar10) {
        puVar12 = (uint *)raw;
        uVar13 = 0;
      }
      if (puVar12 == (uint *)raw) goto LAB_0027b801;
    }
    uVar4 = (uint)(uVar13 >> 3);
    if ((uVar4 == 0) || (puVar19 <= puVar12)) {
switchD_0027b67b_caseD_3:
      bVar10 = false;
      uVar13 = 0;
      puVar9 = (uint *)0x0;
    }
    else {
      switch((uint)uVar13 & 7) {
      case 0:
        puVar11 = (uint *)0x0;
        bVar10 = puVar12 >= puVar19;
        if (puVar12 < puVar19) {
          in_R11 = (uint *)((long)puVar12 + 1);
          puVar9 = (uint *)(ulong)((byte)*puVar12 & 0x7f);
          puVar14 = puVar9;
          uVar6 = 0;
          if ((char)(byte)*puVar12 < '\0') {
            puVar14 = (uint *)0x0;
            uVar6 = 0;
            lVar8 = 7;
            puVar18 = in_R11;
            do {
              bVar20 = 0x38 < lVar8 - 7U;
              bVar10 = bVar20 || puVar19 <= puVar18;
              if (bVar20 || puVar19 <= puVar18) goto LAB_0027b807;
              uVar2 = *puVar18;
              puVar18 = (uint *)((long)puVar18 + 1);
              puVar9 = (uint *)((ulong)puVar9 | (ulong)((byte)uVar2 & 0x7f) << ((byte)lVar8 & 0x3f))
              ;
              lVar8 = lVar8 + 7;
            } while ((char)(byte)uVar2 < '\0');
            puVar14 = (uint *)((ulong)puVar9 & 0xffffffff);
            in_R11 = puVar18;
            uVar6 = (uint)((ulong)puVar9 >> 0x20);
          }
        }
        else {
          puVar14 = (uint *)0x0;
          uVar6 = 0;
        }
LAB_0027b807:
        puVar9 = (uint *)(ulong)uVar6;
        if (bVar10) {
          in_R11 = puVar12;
          puVar9 = puVar11;
          puVar14 = puVar11;
        }
        local_80 = puVar12;
        local_58 = (uint *)raw;
        if (in_R11 != puVar12) goto LAB_0027b82e;
        uVar13 = 0;
        bVar10 = false;
        puVar9 = puVar11;
        goto LAB_0027b870;
      case 1:
        in_R11 = puVar12 + 2;
        if (puVar19 < in_R11) {
LAB_0027b801:
          uVar13 = 0;
          bVar10 = false;
          puVar9 = (uint *)0x0;
          goto LAB_0027b870;
        }
        puVar14 = *(uint **)puVar12;
        puVar9 = (uint *)((ulong)puVar14 >> 0x20);
        break;
      case 2:
        bVar10 = puVar12 >= puVar19;
        puVar9 = local_68;
        if (puVar12 < puVar19) {
          bVar1 = (byte)*puVar12;
          puVar11 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar14 = (uint *)((long)puVar12 + 1U);
          for (; (in_R11 = puVar14, puVar9 = puVar11, (char)bVar1 < '\0' &&
                 (bVar20 = 0x38 < lVar8 - 7U, bVar10 = bVar20 || puVar19 <= puVar14,
                 in_R11 = (uint *)((long)puVar12 + 1U), puVar9 = local_68,
                 !bVar20 && puVar19 > puVar14)); lVar8 = lVar8 + 7) {
            bVar1 = (byte)*puVar14;
            puVar14 = (uint *)((long)puVar14 + 1);
            puVar11 = (uint *)((ulong)puVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f));
          }
        }
        local_68 = puVar9;
        if (bVar10) {
          in_R11 = puVar12;
          local_68 = (uint *)0x0;
        }
        if ((in_R11 == puVar12) || ((uint *)((long)puVar19 - (long)in_R11) < local_68)) {
          puVar9 = (uint *)0x0;
          puVar14 = (uint *)0x0;
          bVar10 = false;
          puVar11 = (uint *)0x0;
        }
        else {
          puVar9 = (uint *)((ulong)in_R11 >> 0x20);
          puVar14 = (uint *)((ulong)in_R11 & 0xffffffff);
          in_R11 = (uint *)((long)in_R11 + (long)local_68);
          bVar10 = true;
          puVar11 = local_68;
        }
        local_80 = puVar12;
        if (!bVar10) goto LAB_0027b801;
        goto LAB_0027b82e;
      default:
        goto switchD_0027b67b_caseD_3;
      case 5:
        in_R11 = puVar12 + 1;
        puVar9 = (uint *)0x0;
        if (puVar19 < in_R11) goto LAB_0027b801;
        puVar14 = (uint *)(ulong)*puVar12;
      }
      puVar11 = (uint *)0x0;
LAB_0027b82e:
      bVar10 = true;
      raw = in_R11;
      if ((uVar4 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
        puVar9 = (uint *)((ulong)puVar14 & 0xffffffff | (long)puVar9 << 0x20);
        uVar13 = (ulong)puVar11 | (uVar13 >> 3) << 0x20 | (ulong)((uint)uVar13 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        puVar9 = (uint *)0x0;
        uVar13 = 0;
      }
    }
LAB_0027b870:
    if (!bVar10) {
      local_78.size_ = (uint32_t)uVar13;
      local_78.type_ = (uint8_t)(uVar13 >> 0x30);
      local_78.id_ = (uint16_t)(uVar13 >> 0x20);
      if (local_78.id_ != 0) {
        local_40 = &this->shm_key_windows_;
        local_48 = &this->sdk_version_;
        local_50 = &this->producer_name_;
        local_78.int_value_ = (uint64_t)puVar9;
        local_60 = this;
        do {
          if ((ushort)(uVar13 >> 0x20) < 9) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar13 >> 0x20) & 0x3f);
          }
          uVar4 = ((uint)(uVar13 >> 0x20) & 0xffff) - 1;
          if (uVar4 < 8) {
            uVar3 = (*(code *)(&DAT_0034fb04 + *(int *)(&DAT_0034fb04 + (ulong)uVar4 * 4)))();
            return (bool)uVar3;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_78,local_38);
          do {
            if (puVar19 <= raw) goto LAB_0027bcc9;
            uVar13 = (ulong)(char)(byte)*raw;
            puVar12 = (uint *)((long)raw + 1);
            if ((long)uVar13 < 0) {
              uVar5 = (ulong)((byte)*raw & 0x7f);
              bVar10 = false;
              uVar13 = uVar5;
              puVar14 = puVar12;
              if ((char)(byte)*raw < '\0') {
                lVar8 = 7;
                puVar11 = puVar12;
                do {
                  bVar10 = 0x38 < lVar8 - 7U || puVar19 <= puVar11;
                  uVar13 = 0;
                  puVar14 = puVar12;
                  if (bVar10) break;
                  uVar4 = *puVar11;
                  puVar14 = (uint *)((long)puVar11 + 1);
                  uVar5 = uVar5 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar8 & 0x3f);
                  lVar8 = lVar8 + 7;
                  uVar13 = uVar5;
                  puVar11 = puVar14;
                } while ((char)(byte)uVar4 < '\0');
              }
              puVar12 = puVar14;
              if (bVar10) {
                puVar12 = (uint *)raw;
                uVar13 = 0;
              }
              if (puVar12 == (uint *)raw) goto LAB_0027bcc9;
            }
            uVar4 = (uint)(uVar13 >> 3);
            if ((uVar4 == 0) || (puVar19 <= puVar12)) {
switchD_0027bb13_caseD_3:
              bVar10 = false;
              uVar13 = 0;
              local_78.int_value_ = (uint64_t)(uint *)0x0;
            }
            else {
              switch((uint)uVar13 & 7) {
              case 0:
                puVar18 = (uint *)0x0;
                bVar10 = puVar12 >= puVar19;
                if (puVar12 < puVar19) {
                  puVar14 = (uint *)((long)puVar12 + 1);
                  puVar11 = (uint *)(ulong)((byte)*puVar12 & 0x7f);
                  puVar9 = puVar14;
                  uVar6 = 0;
                  if ((char)(byte)*puVar12 < '\0') {
                    lVar8 = 7;
                    puVar15 = (uint *)0x0;
                    puVar16 = puVar14;
                    puVar17 = puVar11;
                    do {
                      puVar11 = puVar15;
                      bVar20 = 0x38 < lVar8 - 7U;
                      bVar10 = bVar20 || puVar19 <= puVar16;
                      puVar9 = puVar14;
                      uVar6 = 0;
                      if (bVar20 || puVar19 <= puVar16) break;
                      bVar1 = (byte)*puVar16;
                      puVar16 = (uint *)((long)puVar16 + 1);
                      puVar17 = (uint *)((ulong)puVar17 |
                                        (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f));
                      lVar8 = lVar8 + 7;
                      if (-1 < (char)bVar1) {
                        puVar11 = (uint *)((ulong)puVar17 & 0xffffffff);
                      }
                      puVar15 = puVar11;
                      puVar9 = puVar16;
                      uVar6 = (uint)((ulong)puVar17 >> 0x20);
                    } while (-1 >= (char)bVar1);
                  }
                }
                else {
                  puVar11 = (uint *)0x0;
                  uVar6 = 0;
                }
                if (bVar10) {
                  puVar11 = puVar18;
                }
                puVar14 = (uint *)(ulong)uVar6;
                if (bVar10) {
                  puVar9 = puVar12;
                  puVar14 = puVar18;
                }
                this = local_60;
                local_68 = puVar12;
                local_58 = (uint *)raw;
                if (puVar9 != puVar12) goto LAB_0027bcf2;
                uVar13 = 0;
                bVar10 = false;
                local_78.int_value_ = (uint64_t)puVar18;
                goto LAB_0027bd3c;
              case 1:
                puVar9 = puVar12 + 2;
                if (puVar19 < puVar9) {
LAB_0027bcc9:
                  uVar13 = 0;
                  bVar10 = false;
                  local_78.int_value_ = (uint64_t)(uint *)0x0;
                  goto LAB_0027bd3c;
                }
                puVar11 = *(uint **)puVar12;
                puVar14 = (uint *)((ulong)puVar11 >> 0x20);
                break;
              case 2:
                bVar10 = puVar12 >= puVar19;
                puVar14 = local_80;
                if (puVar12 < puVar19) {
                  puVar11 = (uint *)((long)puVar12 + 1);
                  puVar18 = (uint *)(ulong)((byte)*puVar12 & 0x7f);
                  puVar9 = puVar11;
                  puVar14 = puVar18;
                  if ((char)(byte)*puVar12 < '\0') {
                    lVar8 = 7;
                    puVar15 = puVar11;
                    do {
                      bVar10 = 0x38 < lVar8 - 7U || puVar19 <= puVar15;
                      puVar9 = puVar11;
                      puVar14 = local_80;
                      if (bVar10) break;
                      uVar6 = *puVar15;
                      puVar15 = (uint *)((long)puVar15 + 1);
                      puVar18 = (uint *)((ulong)puVar18 |
                                        (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar8 & 0x3f));
                      lVar8 = lVar8 + 7;
                      puVar9 = puVar15;
                      puVar14 = puVar18;
                    } while ((char)(byte)uVar6 < '\0');
                  }
                }
                local_80 = puVar14;
                puVar11 = (uint *)0x0;
                if (bVar10) {
                  puVar9 = puVar12;
                  local_80 = puVar11;
                }
                if (puVar9 == puVar12) {
                  puVar14 = (uint *)0x0;
                  bVar10 = false;
                  puVar18 = (uint *)0x0;
                }
                else if ((uint *)((long)puVar19 - (long)puVar9) < local_80) {
                  puVar11 = (uint *)0x0;
                  puVar14 = (uint *)0x0;
                  bVar10 = false;
                  puVar18 = (uint *)0x0;
                }
                else {
                  puVar14 = (uint *)((ulong)puVar9 >> 0x20);
                  puVar11 = (uint *)((ulong)puVar9 & 0xffffffff);
                  puVar9 = (uint *)((long)puVar9 + (long)local_80);
                  bVar10 = true;
                  puVar18 = local_80;
                }
                this = local_60;
                if (!bVar10) goto LAB_0027bcc9;
                goto LAB_0027bcf2;
              default:
                goto switchD_0027bb13_caseD_3;
              case 5:
                puVar9 = puVar12 + 1;
                puVar14 = (uint *)0x0;
                if (puVar19 < puVar9) goto LAB_0027bcc9;
                puVar11 = (uint *)(ulong)*puVar12;
              }
              puVar18 = (uint *)0x0;
LAB_0027bcf2:
              bVar10 = true;
              raw = puVar9;
              if ((uVar4 < 0x10000) && (puVar18 < (uint *)0x10000000)) {
                local_78.int_value_ = (ulong)puVar11 & 0xffffffff | (long)puVar14 << 0x20;
                uVar13 = (ulong)puVar18 | (uVar13 >> 3) << 0x20 | (uVar13 & 7) << 0x30;
                bVar10 = false;
              }
              else {
                local_78.int_value_ = 0;
                uVar13 = 0;
              }
            }
LAB_0027bd3c:
          } while (bVar10);
          local_78.size_ = (uint32_t)uVar13;
          local_78.type_ = (uint8_t)(uVar13 >> 0x30);
          local_78.id_ = (uint16_t)(uVar13 >> 0x20);
        } while (local_78.id_ != 0);
      }
      return puVar19 == (uint *)raw;
    }
  } while( true );
}

Assistant:

bool InitializeConnectionRequest::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* shared_memory_page_size_hint_bytes */:
        field.get(&shared_memory_page_size_hint_bytes_);
        break;
      case 2 /* shared_memory_size_hint_bytes */:
        field.get(&shared_memory_size_hint_bytes_);
        break;
      case 3 /* producer_name */:
        field.get(&producer_name_);
        break;
      case 4 /* smb_scraping_mode */:
        field.get(&smb_scraping_mode_);
        break;
      case 6 /* producer_provided_shmem */:
        field.get(&producer_provided_shmem_);
        break;
      case 8 /* sdk_version */:
        field.get(&sdk_version_);
        break;
      case 7 /* shm_key_windows */:
        field.get(&shm_key_windows_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}